

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# work_lda_inc.c
# Opt level: O3

void work_lda_exc_unpol(xc_func_type *p,size_t np,double *rho,xc_lda_out_params *out)

{
  double *pdVar1;
  undefined1 auVar2 [16];
  long lVar3;
  size_t sVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined8 uVar19;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  double dVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  
  if (np != 0) {
    sVar4 = 0;
    do {
      lVar3 = (long)(p->dim).rho * sVar4;
      dVar5 = rho[lVar3];
      if (p->nspin == 2) {
        dVar5 = dVar5 + rho[lVar3 + 1];
      }
      dVar10 = p->dens_threshold;
      if (dVar10 <= dVar5) {
        dVar8 = rho[lVar3];
        dVar6 = cbrt(0.3183098861837907);
        dVar5 = p->zeta_threshold;
        dVar12 = 1.0;
        dVar7 = 1.0;
        if (1.0 <= dVar5) {
          dVar7 = cbrt(dVar5);
          dVar12 = dVar5 * dVar7;
        }
        if (dVar8 <= dVar10) {
          dVar8 = dVar10;
        }
        dVar8 = cbrt(dVar8);
        dVar5 = cbrt(9.0);
        auVar15._8_8_ = dVar8;
        auVar15._0_8_ = dVar7;
        auVar15 = divpd(_DAT_00f56e20,auVar15);
        dVar5 = (auVar15._0_8_ * auVar15._8_8_ * 1.4422495703074083 *
                p->cam_omega * dVar6 * dVar6 * dVar5 * dVar5) / 18.0;
        dVar10 = 1.92;
        if (dVar5 <= 1.92) {
          dVar10 = dVar5;
        }
        dVar7 = atan2(1.0,dVar10);
        dVar9 = log(1.0 / (dVar10 * dVar10) + 1.0);
        if (1.92 <= dVar5) {
          if (dVar5 <= 1.92) {
            dVar5 = 1.92;
          }
          dVar5 = dVar5 * dVar5;
          dVar7 = dVar5 * dVar5;
          dVar10 = dVar7 * dVar7;
          dVar9 = dVar7 * dVar5;
          dVar11 = dVar10 * dVar10;
          auVar13._0_8_ = dVar10 * dVar5;
          auVar13._8_8_ = dVar7 * dVar10;
          auVar14._0_8_ = dVar9 * dVar10;
          auVar14._8_8_ = dVar11;
          auVar16 = divpd(_DAT_00f56e20,auVar14);
          uVar19 = auVar16._8_8_;
          auVar23._8_8_ = uVar19;
          auVar23._0_8_ = uVar19;
          auVar25._8_8_ = uVar19;
          auVar25._0_8_ = uVar19;
          auVar24._8_8_ = uVar19;
          auVar24._0_8_ = uVar19;
          auVar21 = divpd(auVar23,auVar13);
          auVar14 = divpd(auVar16,_DAT_00f70470);
          auVar22._8_8_ = dVar7;
          auVar22._0_8_ = dVar5;
          auVar16 = divpd(auVar25,auVar22);
          auVar23 = divpd(auVar16,_DAT_00f70480);
          auVar16._8_8_ = dVar10;
          auVar16._0_8_ = dVar9;
          auVar16 = divpd(auVar24,auVar16);
          auVar25 = divpd(auVar16,_DAT_00f70490);
          auVar22 = divpd(auVar21,_DAT_00f704a0);
          auVar17._8_8_ = 0x3ff0000000000000;
          auVar17._0_8_ = uVar19;
          auVar21._8_8_ = dVar11 * dVar11;
          auVar21._0_8_ = dVar10 * dVar9;
          auVar16 = divpd(auVar17,auVar21);
          auVar18._8_8_ = auVar16._8_8_;
          auVar16 = divpd(auVar16,_DAT_00f704b0);
          auVar18._0_8_ = auVar18._8_8_;
          auVar2._8_8_ = dVar7;
          auVar2._0_8_ = dVar5;
          auVar21 = divpd(auVar18,auVar2);
          auVar21 = divpd(auVar21,_DAT_00f704c0);
          dVar5 = ((((((((((((1.0 / auVar13._8_8_) / -364.0 +
                             (1.0 / auVar13._0_8_) / 231.0 +
                             (1.0 / dVar10) / -135.0 +
                             (1.0 / dVar9) / 70.0 + (1.0 / dVar7) / -30.0 + (1.0 / dVar5) / 9.0 +
                            auVar14._0_8_) - auVar14._8_8_) + auVar23._0_8_) - auVar23._8_8_) +
                        auVar25._0_8_) - auVar25._8_8_) + auVar22._0_8_) - auVar22._8_8_) +
                    auVar16._0_8_) - auVar16._8_8_) + auVar21._0_8_) - auVar21._8_8_;
        }
        else {
          dVar5 = (dVar7 + (1.0 - dVar9 * (dVar10 * dVar10 + 3.0)) * dVar10 * 0.25) *
                  -2.6666666666666665 * dVar10 + 1.0;
        }
        dVar7 = dVar6 * 1.4422495703074083 * auVar15._8_8_ * 2.519842099789747;
        dVar9 = SQRT(dVar7);
        dVar10 = dVar9;
        if (dVar7 < 0.0) {
          dVar10 = sqrt(dVar7);
          dVar9 = sqrt(dVar7);
        }
        dVar20 = (1.0 / (dVar8 * dVar8)) * 1.5874010519681996 * dVar6 * dVar6 * 2.080083823051904;
        dVar11 = log(16.081979498692537 /
                     (dVar20 * 0.123235 +
                     dVar9 * dVar7 * 0.204775 + dVar10 * 3.79785 + dVar7 * 0.8969) + 1.0);
        dVar10 = log(29.608749977793437 /
                     (dVar20 * 0.1241775 +
                     dVar9 * dVar7 * 0.1100325 + dVar10 * 5.1785 + dVar7 * 0.905775) + 1.0);
        pdVar1 = out->zk;
        if ((pdVar1 != (double *)0x0) && ((p->info->flags & 1) != 0)) {
          lVar3 = (long)(p->dim).zk * sVar4;
          pdVar1[lVar3] =
               dVar6 * 1.4422495703074083 * 2.519842099789747 *
               dVar12 * 1.5874010519681996 * dVar8 * dVar5 * -0.1875 +
               (1.0 / (dVar20 * 0.25 + dVar7 * -0.225 + 3.2)) * 3.4602 *
               (dVar11 * -0.0621814 * (dVar7 * 0.053425 + 1.0) +
               (dVar12 + dVar12 + -2.0) * 1.9236610509315362 *
               (dVar7 * 0.0278125 + 1.0) * dVar10 * 0.0197516734986138) + pdVar1[lVar3];
        }
      }
      sVar4 = sVar4 + 1;
    } while (np != sVar4);
  }
  return;
}

Assistant:

static void
WORK_LDA(ORDER_TXT, SPIN_TXT)
(const XC(func_type) *p, size_t np, const double *rho, xc_lda_out_params *out)
{

#ifdef XC_DEBUG
  /* This throws an exception when floating point errors are encountered */
  /*feenableexcept(FE_DIVBYZERO | FE_INVALID);*/
#endif

  size_t ip;
  double dens;
  double my_rho[2] = {0.0, 0.0};

  for(ip = 0; ip < np; ip++){
    /* Screen low density */
    dens = (p->nspin == XC_POLARIZED) ? VAR(rho, ip, 0) + VAR(rho, ip, 1) : VAR(rho, ip, 0);
    if(dens < p->dens_threshold)
      continue;
    
    /* sanity check of input parameters */
    my_rho[0] = m_max(p->dens_threshold, VAR(rho, ip, 0));
    if(p->nspin == XC_POLARIZED){
      my_rho[1] = m_max(p->dens_threshold, VAR(rho, ip, 1));
    }

    FUNC(ORDER_TXT, SPIN_TXT)(p, ip, my_rho, out);

    /* check for NaNs */
#ifdef XC_DEBUG
    {
      const xc_dimensions *dim = &(p->dim);
      int ii, is_OK = 1;

      if(out->zk != NULL)
        is_OK = is_OK & isfinite(out->VAR(zk, ip, 0));

      if(out->vrho != NULL){
        for(ii=0; ii < dim->vrho; ii++)
          is_OK = is_OK && isfinite(out->VAR(vrho, ip, ii));
      }

      if(!is_OK){
        printf("Problem in the evaluation of the functional\n");
        if(p->nspin == XC_UNPOLARIZED){
          printf("./xc-get_data %d 1 %le 0.0 0.0 0.0 0.0 0.0 0.0 0.0 0.0\n",
                 p->info->number, VAR(rho, ip, 0));
        }else{
          printf("./xc-get_data %d 2 %le %le 0.0 0.0 0.0 0.0 0.0 0.0 0.0\n",
                 p->info->number, VAR(rho, ip, 0), VAR(rho, ip, 1));
        }
      }
    }
#endif
  }   /* for(ip) */

}